

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

shared_ptr<gui::DialogBox>
gui::DialogBox::create(shared_ptr<gui::DialogBoxStyle> *style,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<gui::DialogBox> sVar1;
  element_type *this;
  String *in_stack_ffffffffffffffd0;
  shared_ptr<gui::DialogBoxStyle> *in_stack_ffffffffffffffd8;
  DialogBox *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  operator_new(0x278);
  std::shared_ptr<gui::DialogBoxStyle>::shared_ptr
            ((shared_ptr<gui::DialogBoxStyle> *)this,(shared_ptr<gui::DialogBoxStyle> *)in_RDI);
  DialogBox(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::shared_ptr<gui::DialogBox>::shared_ptr<gui::DialogBox,void>
            ((shared_ptr<gui::DialogBox> *)this,in_RDI);
  std::shared_ptr<gui::DialogBoxStyle>::~shared_ptr((shared_ptr<gui::DialogBoxStyle> *)0x24cdb6);
  sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::DialogBox>)
         sVar1.super___shared_ptr<gui::DialogBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<DialogBox> DialogBox::create(std::shared_ptr<DialogBoxStyle> style, const sf::String& name) {
    return std::shared_ptr<DialogBox>(new DialogBox(style, name));
}